

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::name_formatter<spdlog::details::null_scoped_padder>::format
          (name_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  string_view_t view;
  
  view.size_ = (size_t)dest;
  view.data_ = (char *)(msg->logger_name).size_;
  fmt_helper::append_string_view((fmt_helper *)(msg->logger_name).data_,view,dest);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        ScopedPadder p(msg.logger_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(msg.logger_name, dest);
    }